

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.c
# Opt level: O0

void cdns_debug_dump(void)

{
  char *pcVar1;
  uint local_4c;
  char local_48 [4];
  int i;
  char buf [55];
  
  _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",0x3c0,
             "cdns_debug_dump",0,6,"Dumping data for DNS servers:");
  for (local_4c = 0; local_4c < g_svr_count; local_4c = local_4c + 1) {
    pcVar1 = fmt_sockaddr_port((sockaddr *)&g_svr_cfg[(int)local_4c].addr,local_48,0x37);
    _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",0x3c8,
               "cdns_debug_dump",0,6,"DNS %s: rsp/req: %u/%u avg rtt: %ums",pcVar1,
               g_svr_cfg[(int)local_4c].stats.n_rsp,g_svr_cfg[(int)local_4c].stats.n_req,
               g_svr_cfg[(int)local_4c].stats.avg_rtt);
  }
  _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",0x3ca,
             "cdns_debug_dump",0,6,"End of data dumping.");
  return;
}

Assistant:

void cdns_debug_dump()
{
    char buf[INET_ADDR_PORT_STRLEN];

    log_error(LOG_INFO, "Dumping data for DNS servers:");

    for (int i = 0; i < g_svr_count; i++) {
        log_error(LOG_INFO, "DNS %s: rsp/req: %u/%u avg rtt: %ums",
                            fmt_sockaddr_port((struct sockaddr *)&g_svr_cfg[i].addr,
                                              &buf[0], sizeof(buf)),
                            g_svr_cfg[i].stats.n_rsp,
                            g_svr_cfg[i].stats.n_req,
                            g_svr_cfg[i].stats.avg_rtt);
    }
    log_error(LOG_INFO, "End of data dumping.");

}